

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ResultBuilder::handleResult(ResultBuilder *this,AssertionResult *result)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  IResultCapture *pIVar4;
  IContext *pIVar5;
  IConfig *pIVar6;
  undefined4 extraout_var;
  ulong uVar7;
  Ptr<const_Catch::IConfig> local_20;
  AssertionResult *local_18;
  AssertionResult *result_local;
  ResultBuilder *this_local;
  
  local_18 = result;
  result_local = (AssertionResult *)this;
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[2])(pIVar4,local_18);
  bVar1 = AssertionResult::isOk(local_18);
  if (!bVar1) {
    pIVar5 = getCurrentContext();
    (*pIVar5->_vptr_IContext[6])();
    pIVar6 = Ptr<const_Catch::IConfig>::operator->(&local_20);
    uVar2 = (*(pIVar6->super_IShared).super_NonCopyable._vptr_NonCopyable[8])();
    Ptr<const_Catch::IConfig>::~Ptr(&local_20);
    if ((uVar2 & 1) != 0) {
      this->m_shouldDebugBreak = true;
    }
    pIVar5 = getCurrentContext();
    iVar3 = (*pIVar5->_vptr_IContext[3])();
    uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))();
    if (((uVar7 & 1) != 0) || (((this->m_assertionInfo).resultDisposition & Normal) != 0)) {
      this->m_shouldThrow = true;
    }
  }
  return;
}

Assistant:

void ResultBuilder::handleResult( AssertionResult const& result )
    {
        getResultCapture().assertionEnded( result );

        if( !result.isOk() ) {
            if( getCurrentContext().getConfig()->shouldDebugBreak() )
                m_shouldDebugBreak = true;
            if( getCurrentContext().getRunner()->aborting() || (m_assertionInfo.resultDisposition & ResultDisposition::Normal) )
                m_shouldThrow = true;
        }
    }